

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_feature_helper.h
# Opt level: O0

JavaFeatures * __thiscall
google::protobuf::internal::InternalFeatureHelper::
GetResolvedFeatureExtension<google::protobuf::FileDescriptor,pb::JavaFeatures,(unsigned_char)11,false>
          (JavaFeatures *__return_storage_ptr__,InternalFeatureHelper *this,
          FileDescriptor *descriptor,
          ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false>
          *extension)

{
  bool bVar1;
  Edition EVar2;
  FeatureSet *this_00;
  ConstType pJVar3;
  DescriptorPool *this_01;
  Edition in_R8D;
  string_view sVar4;
  string_view data;
  FeatureSet local_d0;
  undefined1 local_80 [8];
  JavaFeatures lang_features_ret;
  undefined1 local_48 [8];
  JavaFeatures lang_features;
  ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false>
  *extension_local;
  FileDescriptor *descriptor_local;
  
  lang_features._32_8_ = descriptor;
  this_00 = GetFeatures<google::protobuf::FileDescriptor>((FileDescriptor *)this);
  pJVar3 = FeatureSet::
           GetExtension<google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false,_0>
                     (this_00,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false>
                               *)lang_features._32_8_);
  pb::JavaFeatures::JavaFeatures((JavaFeatures *)local_48,pJVar3);
  this_01 = GetDescriptorPool((FileDescriptor *)this);
  bVar1 = DescriptorPool::
          ResolvesFeaturesFor<google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,(unsigned_char)11,false>
                    (this_01,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false>
                              *)lang_features._32_8_);
  if (bVar1) {
    pb::JavaFeatures::JavaFeatures(__return_storage_ptr__,(JavaFeatures *)local_48);
    lang_features_ret.field_0._impl_.nest_in_file_class_ = 1;
  }
  else {
    sVar4 = pb::internal::GetFeatureSetDefaultsData<pb::JavaFeatures>();
    data._M_len = sVar4._M_str;
    EVar2 = GetEdition((FileDescriptor *)this);
    data._M_str._0_4_ = EVar2;
    data._M_str._4_4_ = 0;
    ParseAndGetEditionResolvedFeatureSet
              (&local_d0,(InternalFeatureHelper *)sVar4._M_len,data,in_R8D);
    pJVar3 = FeatureSet::
             GetExtension<google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false,_0>
                       (&local_d0,
                        (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false>
                         *)lang_features._32_8_);
    pb::JavaFeatures::JavaFeatures((JavaFeatures *)local_80,pJVar3);
    FeatureSet::~FeatureSet(&local_d0);
    pb::JavaFeatures::MergeFrom((JavaFeatures *)local_80,(JavaFeatures *)local_48);
    pb::JavaFeatures::JavaFeatures(__return_storage_ptr__,(JavaFeatures *)local_80);
    lang_features_ret.field_0._impl_.nest_in_file_class_ = 1;
    pb::JavaFeatures::~JavaFeatures((JavaFeatures *)local_80);
  }
  pb::JavaFeatures::~JavaFeatures((JavaFeatures *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static auto GetResolvedFeatureExtension(
      const DescriptorT& descriptor,
      const google::protobuf::internal::ExtensionIdentifier<
          FeatureSet, MessageTypeTraits<ExtType>, field_type, is_packed>&
          extension) {
    auto lang_features = GetFeatures(descriptor).GetExtension(extension);
    if (GetDescriptorPool(descriptor).ResolvesFeaturesFor(extension)) {
      return lang_features;
    }

    auto lang_features_ret =
        ParseAndGetEditionResolvedFeatureSet(
            ::pb::internal::GetFeatureSetDefaultsData<ExtType>(),
            GetEdition(descriptor))
            .GetExtension(extension);
    lang_features_ret.MergeFrom(lang_features);
    return lang_features_ret;
  }